

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall czh::lexer::Lexer::check_token(Lexer *this,Token *token)

{
  Token *pTVar1;
  bool bVar2;
  State SVar3;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  TokenType local_50 [5];
  allocator<char> local_39;
  string local_38;
  Token *local_18;
  Token *token_local;
  Lexer *this_local;
  
  local_18 = token;
  token_local = (Token *)this;
  if (token->type == FEND) {
    SVar3 = Match::get_state(&this->match);
    if (SVar3 == END) {
      return;
    }
    SVar3 = Match::get_state(&this->match);
    pTVar1 = local_18;
    if (SVar3 == INIT) {
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unexpected end of file.",&local_39);
    czh::token::Token::report_error(pTVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  bVar2 = Match::end(&this->match);
  if ((bVar2) && (local_18->type != SEND)) {
    local_50[0] = SEND;
    Match::match(&this->match,local_50);
  }
  Match::match(&this->match,&local_18->type);
  bVar2 = Match::good(&this->match);
  pTVar1 = local_18;
  if (!bVar2) {
    czh::token::Token::to_string_abi_cxx11_(&local_f0,local_18);
    std::operator+(&local_d0,"Unexpected token \'",&local_f0);
    std::operator+(&local_b0,&local_d0,"\'.Do you mean \'");
    Match::error_correct_abi_cxx11_(&local_110,&this->match);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,"\'?");
    czh::token::Token::report_error(pTVar1,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  return;
}

Assistant:

void check_token(const token::Token &token)
    {
      if (token.type == token::TokenType::FEND)
      {
        if (match.get_state() == State::END || match.get_state() == State::INIT)
          return;
        else
          token.report_error("Unexpected end of file.");
      }
      if (match.end() && token.type != token::TokenType::SEND)
        match.match(token::TokenType::SEND);
      match.match(token.type);
      if (!match.good())
      {
        token.report_error("Unexpected token '" + token.to_string() + "'.Do you mean '"
                           + match.error_correct() + "'?");
      }
    }